

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QSimplexVariable*,double>::emplace<double_const&>
          (QHash<QSimplexVariable*,double> *this,QSimplexVariable **key,double *args)

{
  Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QHash<QSimplexVariable_*,_double> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0) {
    local_28.d = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
LAB_005c6b43:
    pDVar1 = (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0;
LAB_005c6b64:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QSimplexVariable_*,_double>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this = pDVar1;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<double_const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_28.d = (Data *)*args;
        pVar2 = (piter)QHash<QSimplexVariable_*,_double>::emplace_helper<double>
                                 ((QHash<QSimplexVariable_*,_double> *)this,key,(double *)&local_28)
        ;
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_005c6bcf;
    }
    local_28.d = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar1 = *(Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> **)this;
      if (pDVar1 == (Data<QHashPrivate::Node<QSimplexVariable_*,_double>_> *)0x0) goto LAB_005c6b43;
    }
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_005c6b64;
  }
  pVar2 = (piter)emplace_helper<double_const&>(this,key,args);
  QHash<QSimplexVariable_*,_double>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_005c6bcf:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }